

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarextension.cpp
# Opt level: O2

void __thiscall QToolBarExtension::setOrientation(QToolBarExtension *this,Orientation o)

{
  long lVar1;
  QStyle *pQVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined8 uStack_80;
  QIcon local_70;
  QStyleOption opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom(&opt,(QWidget *)this);
  if (o == Horizontal) {
    pQVar2 = QWidget::style((QWidget *)this);
    lVar3 = *(long *)pQVar2;
    uStack_80 = 0x1b;
  }
  else {
    pQVar2 = QWidget::style((QWidget *)this);
    lVar3 = *(long *)pQVar2;
    uStack_80 = 0x1c;
  }
  (**(code **)(lVar3 + 0x100))(&local_70,pQVar2,uStack_80,&opt,this);
  QAbstractButton::setIcon((QAbstractButton *)this,&local_70);
  QIcon::~QIcon(&local_70);
  *(Orientation *)(this + 0x28) = o;
  QStyleOption::~QStyleOption(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarExtension::setOrientation(Qt::Orientation o)
{
    QStyleOption opt;
    opt.initFrom(this);
    if (o == Qt::Horizontal) {
        setIcon(style()->standardIcon(QStyle::SP_ToolBarHorizontalExtensionButton, &opt, this));
    } else {
        setIcon(style()->standardIcon(QStyle::SP_ToolBarVerticalExtensionButton, &opt, this));
    }
    m_orientation = o;
}